

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O2

void __thiscall Assimp::glTFExporter::ExportMeshes(glTFExporter *this)

{
  Asset *pAVar1;
  element_type *peVar2;
  aiMesh *paVar3;
  pointer pPVar4;
  size_t sVar5;
  Buffer *this_00;
  Skin *pSVar6;
  Node *pNVar7;
  pointer paVar8;
  vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> *pvVar9;
  bool bVar10;
  uint uVar11;
  vector<glTF::Skin_*,_std::allocator<glTF::Skin_*>_> *pvVar12;
  Logger *this_01;
  vector<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_> *pvVar13;
  long lVar14;
  value_type pSVar15;
  void *data;
  uint j;
  PrimitiveMode PVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  size_t j_1;
  ulong uVar23;
  aiVector3D *data_00;
  size_t num_tc;
  int i;
  long lVar24;
  Ref<glTF::Buffer> RVar25;
  Ref<glTF::Skin> RVar26;
  Ref<glTF::Mesh> RVar27;
  Ref<glTF::Accessor> RVar28;
  Ref<glTF::Node> RVar29;
  Ref<glTF::Buffer> RStack_177c0;
  ulong uStack_177b0;
  uint uStack_177a4;
  _func_int **pp_Stack_177a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> idx_srcdata_tc;
  Ref<glTF::Skin> RStack_17780;
  vector<glTF::Skin_*,_std::allocator<glTF::Skin_*>_> *pvStack_17770;
  size_t sStack_17768;
  glTFExporter *pgStack_17760;
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> inverseBindMatricesData;
  string meshId;
  value_type pSStack_176e8;
  BinaryStream bs;
  value_type vStack_176c0;
  value_type vStack_176b0;
  Ref<glTF::Mesh> RStack_176a0;
  string skinName;
  string fname;
  string sStack_17650;
  string bufferId;
  string bufferIdPrefix;
  Ref<glTF::Node> meshNode;
  string msg;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  
  idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fname,this->mFilename,(allocator<char> *)&indices);
  sStack_17768 = 0xffffffffffffffff;
  std::__cxx11::string::rfind((char *)&fname,0x5c0dbc);
  std::__cxx11::string::substr((ulong)&bufferIdPrefix,(ulong)&fname);
  pAVar1 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&indices,"",(allocator<char> *)&msg);
  glTF::Asset::FindUniqueID(&bufferId,pAVar1,(string *)&indices,bufferIdPrefix._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&indices);
  peVar2 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  RStack_177c0.vector = (peVar2->mBodyBuffer).vector;
  RStack_177c0.index = (peVar2->mBodyBuffer).index;
  if (RStack_177c0.vector == (vector<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_> *)0x0) {
    RVar25 = glTF::LazyDict<glTF::Buffer>::Create(&peVar2->buffers,bufferId._M_dataplus._M_p);
    RStack_177c0.vector = RVar25.vector;
    RStack_177c0.index = RVar25.index;
  }
  uVar22 = (ulong)this->mScene->mNumMeshes;
  uVar20 = 0;
  do {
    uVar17 = uVar20;
    if (uVar22 == uVar17) break;
    paVar3 = this->mScene->mMeshes[uVar17];
    uVar20 = uVar17 + 1;
  } while ((paVar3->mBones == (aiBone **)0x0) || (paVar3->mNumBones == 0));
  RStack_17780.vector = (vector<glTF::Skin_*,_std::allocator<glTF::Skin_*>_> *)0x0;
  RStack_17780.index = 0;
  pAVar1 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&indices,"skin",(allocator<char> *)&msg);
  glTF::Asset::FindUniqueID(&skinName,pAVar1,(string *)&indices,"skin");
  std::__cxx11::string::~string((string *)&indices);
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (uVar17 < uVar22) {
    RVar26 = glTF::LazyDict<glTF::Skin>::Create
                       (&((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->skins,skinName._M_dataplus._M_p);
    pvVar12 = RVar26.vector;
    RStack_17780.vector = pvVar12;
    RStack_17780.index = RVar26.index;
    std::__cxx11::string::_M_assign
              ((string *)
               &(pvVar12->super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>)._M_impl.
                super__Vector_impl_data._M_start[RVar26._8_8_ & 0xffffffff]->name);
    uStack_177a4 = RVar26.index;
    pvStack_17770 = pvVar12;
  }
  else {
    uStack_177a4 = 0;
    pvStack_17770 = (vector<glTF::Skin_*,_std::allocator<glTF::Skin_*>_> *)0x0;
  }
  pp_Stack_177a0 = (_func_int **)0x0;
  pgStack_17760 = this;
  for (uVar20 = 0;
      paVar8 = inverseBindMatricesData.
               super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start, uVar20 < this->mScene->mNumMeshes;
      uVar20 = uVar20 + 1) {
    paVar3 = this->mScene->mMeshes[uVar20];
    bVar10 = ExportProperties::GetPropertyBool(this->mProperties,"extensions.Open3DGC.use",false);
    if ((((bVar10) && (paVar3->mPrimitiveTypes == 4)) && (paVar3->mNumVertices != 0)) &&
       (paVar3->mNumFaces != 0)) {
      if (idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      uStack_177b0 = CONCAT44(uStack_177b0._4_4_,
                              (int)CONCAT71((int7)((ulong)idx_srcdata_tc.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 8),1)
                             );
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&idx_srcdata_tc,8);
    }
    else {
      msg._M_dataplus._M_p = (pointer)&msg.field_2;
      msg._M_string_length = 0;
      msg.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::assign((char *)&msg);
      this_01 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[41]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&indices,
                 (char (*) [41])"GLTF: can not use Open3DGC-compression: ");
      std::operator<<((ostream *)&indices,(string *)&msg);
      std::__cxx11::stringbuf::str();
      Logger::warn(this_01,(char *)meshNode.vector);
      std::__cxx11::string::~string((string *)&meshNode);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indices);
      std::__cxx11::string::~string((string *)&msg);
      uStack_177b0 = uStack_177b0 & 0xffffffff00000000;
    }
    pAVar1 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&indices,(paVar3->mName).data,(allocator<char> *)&msg);
    glTF::Asset::FindUniqueID(&meshId,pAVar1,(string *)&indices,"mesh");
    std::__cxx11::string::~string((string *)&indices);
    RVar27 = glTF::LazyDict<glTF::Mesh>::Create
                       (&((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->meshes,meshId._M_dataplus._M_p);
    pvVar13 = RVar27.vector;
    uVar19 = RVar27.index;
    RStack_176a0.vector = pvVar13;
    RStack_176a0.index = uVar19;
    std::vector<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>::resize
              (&(pvVar13->super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar19]->primitives,1);
    pPVar4 = *(pointer *)
              ((long)&((pvVar13->super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar19]->primitives).
                      super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                      ._M_impl + 8);
    uVar21 = paVar3->mMaterialIndex;
    pPVar4[-1].material.vector =
         &(((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          materials).mObjs;
    pPVar4[-1].material.index = uVar21;
    if ((char)uStack_177b0 != '\0') {
      pp_Stack_177a0 =
           (_func_int **)
           ((RStack_177c0.vector)->
           super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
           super__Vector_impl_data._M_start[RStack_177c0.index]->byteLength;
    }
    RVar28 = ExportData((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,&meshId,&RStack_177c0,paVar3->mNumVertices,paVar3->mVertices,VEC3,
                        VEC3,ComponentType_FLOAT,false);
    vStack_176b0.vector = RVar28.vector;
    vStack_176b0.index = RVar28.index;
    if (vStack_176b0.vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
      std::vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::push_back
                (&pPVar4[-1].attributes.position,&vStack_176b0);
    }
    data_00 = paVar3->mNormals;
    if ((char)uStack_177b0 != '\0') {
      if (data_00 == (aiVector3D *)0x0) {
        data_00 = (aiVector3D *)0x0;
      }
      else {
        sStack_17768 = ((RStack_177c0.vector)->
                       super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[RStack_177c0.index]->byteLength;
      }
    }
    RVar28 = ExportData((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,&meshId,&RStack_177c0,paVar3->mNumVertices,data_00,VEC3,VEC3,
                        ComponentType_FLOAT,false);
    vStack_176c0.vector = RVar28.vector;
    vStack_176c0.index = RVar28.index;
    if (vStack_176c0.vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
      std::vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::push_back
                (&pPVar4[-1].attributes.normal,&vStack_176c0);
    }
    for (lVar24 = 0; lVar24 != 8; lVar24 = lVar24 + 1) {
      uVar21 = paVar3->mNumUVComponents[lVar24];
      if (1 < uVar21) {
        lVar14 = 4;
        for (uVar18 = 0; uVar18 < paVar3->mNumVertices; uVar18 = uVar18 + 1) {
          *(float *)((long)&paVar3->mTextureCoords[lVar24]->x + lVar14) =
               1.0 - *(float *)((long)&paVar3->mTextureCoords[lVar24]->x + lVar14);
          lVar14 = lVar14 + 0xc;
        }
        uVar21 = paVar3->mNumUVComponents[lVar24];
      }
      if (uVar21 != 0) {
        if ((char)uStack_177b0 != '\0') {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&idx_srcdata_tc,
                     &((RStack_177c0.vector)->
                      super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[RStack_177c0.index]->byteLength);
        }
        this = pgStack_17760;
        RVar28 = ExportData((pgStack_17760->mAsset).
                            super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            &meshId,&RStack_177c0,paVar3->mNumVertices,
                            paVar3->mTextureCoords[lVar24],VEC3,(uVar21 != 2) + VEC2,
                            ComponentType_FLOAT,false);
        indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)RVar28.vector;
        indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(indices.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,RVar28.index);
        if ((vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)
            indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
          std::vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::
          push_back(&pPVar4[-1].attributes.texcoord,(value_type *)&indices);
        }
      }
    }
    sVar5 = ((RStack_177c0.vector)->
            super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
            super__Vector_impl_data._M_start[RStack_177c0.index]->byteLength;
    if (paVar3->mNumFaces != 0) {
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar21 = paVar3->mFaces->mNumIndices;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                (&indices,(ulong)(paVar3->mNumFaces * uVar21));
      lVar24 = 0;
      for (uVar18 = 0; uVar18 < paVar3->mNumFaces; uVar18 = uVar18 + 1) {
        for (uVar23 = 0; uVar21 != uVar23; uVar23 = uVar23 + 1) {
          *(short *)((long)indices.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar23 * 2 + lVar24) =
               (short)paVar3->mFaces[uVar18].mIndices[uVar23];
        }
        lVar24 = lVar24 + (ulong)uVar21 * 2;
      }
      RVar28 = ExportData((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,&meshId,&RStack_177c0,
                          (uint)((ulong)((long)indices.
                                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)indices.
                                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 1),
                          indices.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start,SCALAR,SCALAR,
                          ComponentType_UNSIGNED_SHORT,true);
      pPVar4[-1].indices.vector = RVar28.vector;
      pPVar4[-1].indices.index = RVar28.index;
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&indices);
    }
    PVar16 = (uint)(paVar3->mPrimitiveTypes != 2) * 3 + PrimitiveMode_LINES;
    if (paVar3->mPrimitiveTypes == 1) {
      PVar16 = PrimitiveMode_POINTS;
    }
    pPVar4[-1].mode = PVar16;
    if ((paVar3->mBones != (aiBone **)0x0) && (paVar3->mNumBones != 0)) {
      ExportSkin((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 paVar3,&RStack_176a0,&RStack_177c0,&RStack_17780,&inverseBindMatricesData);
    }
    if ((char)uStack_177b0 != '\0') {
      o3dgc::BinaryStream::BinaryStream(&bs,0x1000);
      uStack_177b0 = sVar5;
      o3dgc::SC3DMCEncoder<unsigned_short>::SC3DMCEncoder((SC3DMCEncoder<unsigned_short> *)&msg);
      memset((IndexedFaceSet<unsigned_short> *)&indices,0,0x13878);
      o3dgc::SC3DMCEncodeParams::SC3DMCEncodeParams((SC3DMCEncodeParams *)&meshNode);
      ExportProperties::GetPropertyInteger
                (this->mProperties,"extensions.Open3DGC.quantization.POSITION",0xc);
      ExportProperties::GetPropertyInteger
                (this->mProperties,"extensions.Open3DGC.quantization.NORMAL",10);
      uVar11 = ExportProperties::GetPropertyInteger
                         (this->mProperties,"extensions.Open3DGC.quantization.TEXCOORD",10);
      uVar21 = paVar3->mNumVertices;
      for (uVar18 = 0;
          uVar18 < (ulong)((long)idx_srcdata_tc.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)idx_srcdata_tc.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar18 = uVar18 + 1
          ) {
        o3dgc::SC3DMCEncodeParams::SetFloatAttributeQuantBits
                  ((SC3DMCEncodeParams *)&meshNode,0,(ulong)uVar11);
        o3dgc::SC3DMCEncodeParams::SetFloatAttributePredMode
                  ((SC3DMCEncodeParams *)&meshNode,0,O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION);
        o3dgc::IndexedFaceSet<unsigned_short>::SetNFloatAttribute
                  ((IndexedFaceSet<unsigned_short> *)&indices,0,(ulong)paVar3->mNumVertices);
        o3dgc::IndexedFaceSet<unsigned_short>::SetFloatAttributeDim
                  ((IndexedFaceSet<unsigned_short> *)&indices,0,
                   (ulong)paVar3->mNumUVComponents[uVar18]);
        o3dgc::IndexedFaceSet<unsigned_short>::SetFloatAttributeType
                  ((IndexedFaceSet<unsigned_short> *)&indices,0,
                   O3DGC_IFS_FLOAT_ATTRIBUTE_TYPE_TEXCOORD);
        o3dgc::IndexedFaceSet<unsigned_short>::SetFloatAttribute
                  ((IndexedFaceSet<unsigned_short> *)&indices,0,
                   (Real *)((((RStack_177c0.vector)->
                             super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[RStack_177c0.index]->mData).
                            super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                           idx_srcdata_tc.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar18]));
        o3dgc::IndexedFaceSet<unsigned_short>::SetNumFloatAttributes
                  ((IndexedFaceSet<unsigned_short> *)&indices,1);
      }
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(ulong)paVar3->mNumFaces;
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((((RStack_177c0.vector)->
                      super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[RStack_177c0.index]->mData).
                     super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                    uStack_177b0);
      o3dgc::SC3DMCEncodeParams::SetNumFloatAttributes((SC3DMCEncodeParams *)&meshNode,0);
      this = pgStack_17760;
      ExportProperties::GetPropertyBool
                (pgStack_17760->mProperties,"extensions.Open3DGC.binary",true);
      o3dgc::IndexedFaceSet<unsigned_short>::ComputeMinMax
                ((IndexedFaceSet<unsigned_short> *)&indices,O3DGC_SC3DMC_MAX_ALL_DIMS);
      o3dgc::SC3DMCEncoder<unsigned_short>::Encode
                ((SC3DMCEncoder<unsigned_short> *)&msg,(SC3DMCEncodeParams *)&meshNode,
                 (IndexedFaceSet<unsigned_short> *)&indices,&bs);
      this_00 = ((RStack_177c0.vector)->
                super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
                super__Vector_impl_data._M_start[RStack_177c0.index];
      glTF::Buffer::ReplaceData
                (this_00,(size_t)pp_Stack_177a0,this_00->byteLength - (long)pp_Stack_177a0,
                 bs.m_stream.m_buffer,bs.m_stream.m_size);
      pSVar15 = (value_type)operator_new(0x58);
      pSVar15->Type = Compression_Open3DGC;
      pSVar15->_vptr_SExtension = (_func_int **)&PTR__SCompression_Open3DGC_00759080;
      pSVar15[1]._vptr_SExtension = (_func_int **)(pSVar15 + 2);
      *(undefined8 *)&pSVar15[1].Type = 0;
      *(undefined1 *)&pSVar15[2]._vptr_SExtension = 0;
      std::__cxx11::string::_M_assign((string *)(pSVar15 + 1));
      pSVar15[3]._vptr_SExtension = pp_Stack_177a0;
      *(size_t *)&pSVar15[3].Type =
           ((RStack_177c0.vector)->
           super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
           super__Vector_impl_data._M_start[RStack_177c0.index]->byteLength - (long)pp_Stack_177a0;
      bVar10 = ExportProperties::GetPropertyBool
                         (this->mProperties,"extensions.Open3DGC.binary",false);
      *(bool *)&pSVar15[4]._vptr_SExtension = bVar10;
      *(long *)&pSVar15[4].Type =
           (long)indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                 .super__Vector_impl_data._M_start * 3;
      pSVar15[5]._vptr_SExtension = (_func_int **)(ulong)uVar21;
      pSStack_176e8 = pSVar15;
      std::__cxx11::list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>::
      push_back(&(pvVar13->super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar19]->Extension,&pSStack_176e8);
      o3dgc::SC3DMCEncoder<unsigned_short>::~SC3DMCEncoder((SC3DMCEncoder<unsigned_short> *)&msg);
      o3dgc::Vector<unsigned_char>::~Vector(&bs.m_stream);
    }
    std::__cxx11::string::~string((string *)&meshId);
  }
  if (uVar17 < uVar22) {
    uVar20 = (long)inverseBindMatricesData.
                   super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)inverseBindMatricesData.
                   super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 6;
    data = operator_new__(-(ulong)(uVar20 >> 0x3a != 0) |
                          (long)inverseBindMatricesData.
                                super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)inverseBindMatricesData.
                                super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
    for (uVar21 = 0; uVar22 = (ulong)uVar21, uVar22 < uVar20; uVar21 = uVar21 + 1) {
      CopyValue(paVar8 + uVar22,(mat4 *)(uVar22 * 0x40 + (long)data));
    }
    RVar28 = ExportData((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,&skinName,&RStack_177c0,(uint)uVar20,data,MAT4,MAT4,
                        ComponentType_FLOAT,false);
    uVar20 = (ulong)uStack_177a4;
    if (RVar28.vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
      pSVar6 = (pvStack_17770->super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar20];
      (pSVar6->inverseBindMatrices).vector = RVar28.vector;
      (pSVar6->inverseBindMatrices).index = RVar28.index;
    }
    ((pvStack_17770->super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>)._M_impl.
     super__Vector_impl_data._M_start[uVar20]->bindShapeMatrix).isPresent = true;
    pSVar6 = (pvStack_17770->super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar20];
    (pSVar6->bindShapeMatrix).value[0] = 1.0;
    (pSVar6->bindShapeMatrix).value[1] = 0.0;
    (pSVar6->bindShapeMatrix).value[2] = 0.0;
    (pSVar6->bindShapeMatrix).value[3] = 0.0;
    (pSVar6->bindShapeMatrix).value[4] = 0.0;
    (pSVar6->bindShapeMatrix).value[5] = 1.0;
    (pSVar6->bindShapeMatrix).value[6] = 0.0;
    (pSVar6->bindShapeMatrix).value[7] = 0.0;
    (pSVar6->bindShapeMatrix).value[8] = 0.0;
    (pSVar6->bindShapeMatrix).value[9] = 0.0;
    (pSVar6->bindShapeMatrix).value[10] = 1.0;
    (pSVar6->bindShapeMatrix).value[0xb] = 0.0;
    (pSVar6->bindShapeMatrix).value[0xc] = 0.0;
    (pSVar6->bindShapeMatrix).value[0xd] = 0.0;
    (pSVar6->bindShapeMatrix).value[0xe] = 0.0;
    (pSVar6->bindShapeMatrix).value[0xf] = 1.0;
    peVar2 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg._M_dataplus._M_p = (pointer)&(peVar2->nodes).mObjs;
    msg._M_string_length = msg._M_string_length & 0xffffffff00000000;
    meshNode.vector = (vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> *)0x0;
    meshNode.index = 0;
    std::__cxx11::string::string
              ((string *)&indices,
               (string *)
               ((long)&(*(peVar2->meshes).mObjs.
                         super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>._M_impl.
                         super__Vector_impl_data._M_start)->super_Object + 8));
    std::__cxx11::string::string((string *)&sStack_17650,(string *)&indices);
    FindMeshNode((Ref<glTF::Node> *)&msg,&meshNode,&sStack_17650);
    std::__cxx11::string::~string((string *)&sStack_17650);
    RVar29 = FindSkeletonRootJoint(&RStack_17780);
    pvVar9 = meshNode.vector;
    meshId._M_dataplus._M_p = (pointer)RVar29.vector;
    meshId._M_string_length._0_4_ = RVar29.index;
    uVar20 = (ulong)meshNode.index;
    std::vector<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>::push_back
              (&((meshNode.vector)->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)
                ._M_impl.super__Vector_impl_data._M_start[uVar20]->skeletons,(value_type *)&meshId);
    pNVar7 = (pvVar9->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar20];
    (pNVar7->skin).index = RStack_17780.index;
    (pNVar7->skin).vector = RStack_17780.vector;
    std::__cxx11::string::~string((string *)&indices);
  }
  std::_Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::~_Vector_base
            (&inverseBindMatricesData.
              super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>);
  std::__cxx11::string::~string((string *)&skinName);
  std::__cxx11::string::~string((string *)&bufferId);
  std::__cxx11::string::~string((string *)&bufferIdPrefix);
  std::__cxx11::string::~string((string *)&fname);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void glTFExporter::ExportMeshes()
{
    // Not for
    //     using IndicesType = decltype(aiFace::mNumIndices);
    // But yes for
    //     using IndicesType = unsigned short;
    // because "ComponentType_UNSIGNED_SHORT" used for indices. And it's a maximal type according to glTF specification.
    typedef unsigned short IndicesType;

    // Variables needed for compression. BEGIN.
    // Indices, not pointers - because pointer to buffer is changing while writing to it.
    size_t idx_srcdata_begin = 0; // Index of buffer before writing mesh data. Also, index of begin of coordinates array in buffer.
    size_t idx_srcdata_normal = SIZE_MAX;// Index of begin of normals array in buffer. SIZE_MAX - mean that mesh has no normals.
    std::vector<size_t> idx_srcdata_tc;// Array of indices. Every index point to begin of texture coordinates array in buffer.
    size_t idx_srcdata_ind;// Index of begin of coordinates indices array in buffer.
    bool comp_allow;// Point that data of current mesh can be compressed.
    // Variables needed for compression. END.

    std::string fname = std::string(mFilename);
    std::string bufferIdPrefix = fname.substr(0, fname.rfind(".gltf"));
    std::string bufferId = mAsset->FindUniqueID("", bufferIdPrefix.c_str());

    Ref<Buffer> b = mAsset->GetBodyBuffer();
    if (!b) {
       b = mAsset->buffers.Create(bufferId);
    }

    //----------------------------------------
    // Initialize variables for the skin
    bool createSkin = false;
    for (unsigned int idx_mesh = 0; idx_mesh < mScene->mNumMeshes; ++idx_mesh) {
        const aiMesh* aim = mScene->mMeshes[idx_mesh];
        if(aim->HasBones()) {
            createSkin = true;
            break;
        }
    }

    Ref<Skin> skinRef;
    std::string skinName = mAsset->FindUniqueID("skin", "skin");
    std::vector<aiMatrix4x4> inverseBindMatricesData;
    if(createSkin) {
        skinRef = mAsset->skins.Create(skinName);
        skinRef->name = skinName;
    }
    //----------------------------------------

	for (unsigned int idx_mesh = 0; idx_mesh < mScene->mNumMeshes; ++idx_mesh) {
		const aiMesh* aim = mScene->mMeshes[idx_mesh];

		// Check if compressing requested and mesh can be encoded.
#ifdef ASSIMP_IMPORTER_GLTF_USE_OPEN3DGC
		comp_allow = mProperties->GetPropertyBool("extensions.Open3DGC.use", false);
#else
		comp_allow = false;
#endif

		if(comp_allow && (aim->mPrimitiveTypes == aiPrimitiveType_TRIANGLE) && (aim->mNumVertices > 0) && (aim->mNumFaces > 0))
		{
			idx_srcdata_tc.clear();
			idx_srcdata_tc.reserve(AI_MAX_NUMBER_OF_TEXTURECOORDS);
		}
		else
		{
			std::string msg;

			if(aim->mPrimitiveTypes != aiPrimitiveType_TRIANGLE)
				msg = "all primitives of the mesh must be a triangles.";
			else
				msg = "mesh must has vertices and faces.";

            ASSIMP_LOG_WARN_F("GLTF: can not use Open3DGC-compression: ", msg);
            comp_allow = false;
		}

        std::string meshId = mAsset->FindUniqueID(aim->mName.C_Str(), "mesh");
        Ref<Mesh> m = mAsset->meshes.Create(meshId);
        m->primitives.resize(1);
        Mesh::Primitive& p = m->primitives.back();

        p.material = mAsset->materials.Get(aim->mMaterialIndex);

		/******************* Vertices ********************/
		// If compression is used then you need parameters of uncompressed region: begin and size. At this step "begin" is stored.
		if(comp_allow) idx_srcdata_begin = b->byteLength;

        Ref<Accessor> v = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mVertices, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
		if (v) p.attributes.position.push_back(v);

		/******************** Normals ********************/
		if(comp_allow && (aim->mNormals != 0)) idx_srcdata_normal = b->byteLength;// Store index of normals array.

		Ref<Accessor> n = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mNormals, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
		if (n) p.attributes.normal.push_back(n);

		/************** Texture coordinates **************/
        for (int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
            // Flip UV y coords
            if (aim -> mNumUVComponents[i] > 1) {
                for (unsigned int j = 0; j < aim->mNumVertices; ++j) {
                    aim->mTextureCoords[i][j].y = 1 - aim->mTextureCoords[i][j].y;
                }
            }

            if (aim->mNumUVComponents[i] > 0) {
                AttribType::Value type = (aim->mNumUVComponents[i] == 2) ? AttribType::VEC2 : AttribType::VEC3;

				if(comp_allow) idx_srcdata_tc.push_back(b->byteLength);// Store index of texture coordinates array.

				Ref<Accessor> tc = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mTextureCoords[i], AttribType::VEC3, type, ComponentType_FLOAT, false);
				if (tc) p.attributes.texcoord.push_back(tc);
			}
		}

		/*************** Vertices indices ****************/
		idx_srcdata_ind = b->byteLength;// Store index of indices array.

		if (aim->mNumFaces > 0) {
			std::vector<IndicesType> indices;
			unsigned int nIndicesPerFace = aim->mFaces[0].mNumIndices;
            indices.resize(aim->mNumFaces * nIndicesPerFace);
            for (size_t i = 0; i < aim->mNumFaces; ++i) {
                for (size_t j = 0; j < nIndicesPerFace; ++j) {
                    indices[i*nIndicesPerFace + j] = uint16_t(aim->mFaces[i].mIndices[j]);
                }
            }

			p.indices = ExportData(*mAsset, meshId, b, unsigned(indices.size()), &indices[0], AttribType::SCALAR, AttribType::SCALAR, ComponentType_UNSIGNED_SHORT, true);
		}

        switch (aim->mPrimitiveTypes) {
            case aiPrimitiveType_POLYGON:
                p.mode = PrimitiveMode_TRIANGLES; break; // TODO implement this
            case aiPrimitiveType_LINE:
                p.mode = PrimitiveMode_LINES; break;
            case aiPrimitiveType_POINT:
                p.mode = PrimitiveMode_POINTS; break;
            default: // aiPrimitiveType_TRIANGLE
                p.mode = PrimitiveMode_TRIANGLES;
        }

    /*************** Skins ****************/
    if(aim->HasBones()) {
        ExportSkin(*mAsset, aim, m, b, skinRef, inverseBindMatricesData);
    }

		/****************** Compression ******************/
		///TODO: animation: weights, joints.
		if(comp_allow)
		{
#ifdef ASSIMP_IMPORTER_GLTF_USE_OPEN3DGC
			// Only one type of compression supported at now - Open3DGC.
			//
			o3dgc::BinaryStream bs;
			o3dgc::SC3DMCEncoder<IndicesType> encoder;
			o3dgc::IndexedFaceSet<IndicesType> comp_o3dgc_ifs;
			o3dgc::SC3DMCEncodeParams comp_o3dgc_params;

			//
			// Fill data for encoder.
			//
			// Quantization
			unsigned quant_coord = mProperties->GetPropertyInteger("extensions.Open3DGC.quantization.POSITION", 12);
			unsigned quant_normal = mProperties->GetPropertyInteger("extensions.Open3DGC.quantization.NORMAL", 10);
			unsigned quant_texcoord = mProperties->GetPropertyInteger("extensions.Open3DGC.quantization.TEXCOORD", 10);

			// Prediction
			o3dgc::O3DGCSC3DMCPredictionMode prediction_position = o3dgc::O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
			o3dgc::O3DGCSC3DMCPredictionMode prediction_normal =  o3dgc::O3DGC_SC3DMC_SURF_NORMALS_PREDICTION;
			o3dgc::O3DGCSC3DMCPredictionMode prediction_texcoord = o3dgc::O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;

			// IndexedFacesSet: "Crease angle", "solid", "convex" are set to default.
			comp_o3dgc_ifs.SetCCW(true);
			comp_o3dgc_ifs.SetIsTriangularMesh(true);
			comp_o3dgc_ifs.SetNumFloatAttributes(0);
			// Coordinates
			comp_o3dgc_params.SetCoordQuantBits(quant_coord);
			comp_o3dgc_params.SetCoordPredMode(prediction_position);
			comp_o3dgc_ifs.SetNCoord(aim->mNumVertices);
			comp_o3dgc_ifs.SetCoord((o3dgc::Real* const)&b->GetPointer()[idx_srcdata_begin]);
			// Normals
			if(idx_srcdata_normal != SIZE_MAX)
			{
				comp_o3dgc_params.SetNormalQuantBits(quant_normal);
				comp_o3dgc_params.SetNormalPredMode(prediction_normal);
				comp_o3dgc_ifs.SetNNormal(aim->mNumVertices);
				comp_o3dgc_ifs.SetNormal((o3dgc::Real* const)&b->GetPointer()[idx_srcdata_normal]);
			}

			// Texture coordinates
			for(size_t num_tc = 0; num_tc < idx_srcdata_tc.size(); num_tc++)
			{
				size_t num = comp_o3dgc_ifs.GetNumFloatAttributes();

				comp_o3dgc_params.SetFloatAttributeQuantBits(static_cast<unsigned long>(num), quant_texcoord);
				comp_o3dgc_params.SetFloatAttributePredMode(static_cast<unsigned long>(num), prediction_texcoord);
				comp_o3dgc_ifs.SetNFloatAttribute(static_cast<unsigned long>(num), aim->mNumVertices);// number of elements.
				comp_o3dgc_ifs.SetFloatAttributeDim(static_cast<unsigned long>(num), aim->mNumUVComponents[num_tc]);// components per element: aiVector3D => x * float
				comp_o3dgc_ifs.SetFloatAttributeType(static_cast<unsigned long>(num), o3dgc::O3DGC_IFS_FLOAT_ATTRIBUTE_TYPE_TEXCOORD);
				comp_o3dgc_ifs.SetFloatAttribute(static_cast<unsigned long>(num), (o3dgc::Real* const)&b->GetPointer()[idx_srcdata_tc[num_tc]]);
				comp_o3dgc_ifs.SetNumFloatAttributes(static_cast<unsigned long>(num + 1));
			}

			// Coordinates indices
			comp_o3dgc_ifs.SetNCoordIndex(aim->mNumFaces);
			comp_o3dgc_ifs.SetCoordIndex((IndicesType* const)&b->GetPointer()[idx_srcdata_ind]);
			// Prepare to encoding
			comp_o3dgc_params.SetNumFloatAttributes(comp_o3dgc_ifs.GetNumFloatAttributes());
			if(mProperties->GetPropertyBool("extensions.Open3DGC.binary", true))
				comp_o3dgc_params.SetStreamType(o3dgc::O3DGC_STREAM_TYPE_BINARY);
			else
				comp_o3dgc_params.SetStreamType(o3dgc::O3DGC_STREAM_TYPE_ASCII);

			comp_o3dgc_ifs.ComputeMinMax(o3dgc::O3DGC_SC3DMC_MAX_ALL_DIMS);
			//
			// Encoding
			//
			encoder.Encode(comp_o3dgc_params, comp_o3dgc_ifs, bs);
			// Replace data in buffer.
			b->ReplaceData(idx_srcdata_begin, b->byteLength - idx_srcdata_begin, bs.GetBuffer(), bs.GetSize());
			//
			// Add information about extension to mesh.
			//
			// Create extension structure.
			Mesh::SCompression_Open3DGC* ext = new Mesh::SCompression_Open3DGC;

			// Fill it.
			ext->Buffer = b->id;
			ext->Offset = idx_srcdata_begin;
			ext->Count = b->byteLength - idx_srcdata_begin;
			ext->Binary = mProperties->GetPropertyBool("extensions.Open3DGC.binary");
			ext->IndicesCount = comp_o3dgc_ifs.GetNCoordIndex() * 3;
			ext->VerticesCount = comp_o3dgc_ifs.GetNCoord();
			// And assign to mesh.
			m->Extension.push_back(ext);
#endif
		}// if(comp_allow)
	}// for (unsigned int i = 0; i < mScene->mNumMeshes; ++i)

    //----------------------------------------
    // Finish the skin
    // Create the Accessor for skinRef->inverseBindMatrices
    if (createSkin) {
        mat4* invBindMatrixData = new mat4[inverseBindMatricesData.size()];
        for ( unsigned int idx_joint = 0; idx_joint < inverseBindMatricesData.size(); ++idx_joint) {
            CopyValue(inverseBindMatricesData[idx_joint], invBindMatrixData[idx_joint]);
        }

        Ref<Accessor> invBindMatrixAccessor = ExportData(*mAsset, skinName, b, static_cast<unsigned int>(inverseBindMatricesData.size()), invBindMatrixData, AttribType::MAT4, AttribType::MAT4, ComponentType_FLOAT);
        if (invBindMatrixAccessor) skinRef->inverseBindMatrices = invBindMatrixAccessor;

        // Identity Matrix   =====>  skinRef->bindShapeMatrix
        // Temporary. Hard-coded identity matrix here
        skinRef->bindShapeMatrix.isPresent = true;
        IdentityMatrix4(skinRef->bindShapeMatrix.value);

        // Find node that contains this mesh and add "skeletons" and "skin" attributes to that node.
        Ref<Node> rootNode = mAsset->nodes.Get(unsigned(0));
        Ref<Node> meshNode;
        std::string meshID = mAsset->meshes.Get(unsigned(0))->id;
        FindMeshNode(rootNode, meshNode, meshID);

        Ref<Node> rootJoint = FindSkeletonRootJoint(skinRef);
        meshNode->skeletons.push_back(rootJoint);
        meshNode->skin = skinRef;
    }
}